

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockSupportTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupMockSupportTest::~TEST_GROUP_CppUTestGroupMockSupportTest
          (TEST_GROUP_CppUTestGroupMockSupportTest *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMockSupportTest_002e4400;
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&this->failureReporterInstaller);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest(&this->expectations);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_GROUP(MockSupportTest)
{
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;

  void teardown() _override
  {
      mock().checkExpectations();
      CHECK_NO_MOCK_FAILURE();
      MockFailureReporterForTest::clearReporter();
      mock().clear();
  }
}